

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O3

vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_> * __thiscall
elf_parser::Elf_parser::get_symbols
          (vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>
           *__return_storage_ptr__,Elf_parser *this)

{
  string *psVar1;
  uint *puVar2;
  uint8_t *sym_type;
  undefined1 auVar3 [16];
  pointer psVar4;
  int iVar5;
  ulong uVar6;
  char *this_00;
  Elf_parser *pEVar7;
  Elf_parser *this_01;
  pointer psVar8;
  vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_> *symbols;
  vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> secs;
  allocator local_189;
  vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_> *local_188;
  undefined1 local_180 [80];
  vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> local_130;
  pointer local_118;
  string *local_110;
  ulong local_108;
  undefined1 local_100 [48];
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_188 = __return_storage_ptr__;
  local_180._32_8_ = this;
  get_sections(&local_130,this);
  psVar4 = local_130.
           super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (local_130.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_130.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_180._56_8_ = (uint8_t *)0x0;
  }
  else {
    local_180._56_8_ = (uint8_t *)0x0;
    psVar8 = local_130.
             super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar5 = std::__cxx11::string::compare((char *)&psVar8->section_type);
      if ((iVar5 == 0) &&
         (iVar5 = std::__cxx11::string::compare((char *)&psVar8->section_name), iVar5 == 0)) {
        local_180._56_8_ = *(uint8_t **)(local_180._32_8_ + 0x20) + psVar8->section_offset;
        break;
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar4);
  }
  psVar4 = local_130.
           super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (local_130.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_130.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_180._48_8_ = (uint8_t *)0x0;
  }
  else {
    local_180._48_8_ = (uint8_t *)0x0;
    psVar8 = local_130.
             super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar5 = std::__cxx11::string::compare((char *)&psVar8->section_type);
      if ((iVar5 == 0) &&
         (iVar5 = std::__cxx11::string::compare((char *)&psVar8->section_name), iVar5 == 0)) {
        local_180._48_8_ = *(uint8_t **)(local_180._32_8_ + 0x20) + psVar8->section_offset;
        break;
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar4);
  }
  (local_188->super__Vector_base<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_188->super__Vector_base<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_188->super__Vector_base<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118 = local_130.
              super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_130.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_130.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      psVar1 = &(local_130.
                 super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
                 _M_impl.super__Vector_impl_data._M_start)->section_type;
      this_00 = "SHT_SYMTAB";
      local_180._40_8_ =
           local_130.
           super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>._M_impl
           .super__Vector_impl_data._M_start;
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 == 0) {
LAB_00113f10:
        uVar6 = (ulong)*(int *)(local_180._40_8_ + 0x58);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar6;
        local_180._64_8_ = SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
        if (0x17 < uVar6) {
          local_180._64_8_ = uVar6 / 0x18;
          local_180._72_8_ =
               *(uint8_t **)(local_180._32_8_ + 0x20) + *(intptr_t *)(local_180._40_8_ + 8);
          local_110 = (string *)(local_180._40_8_ + 0x18);
          uVar6 = 0;
          do {
            local_100._8_8_ = 0;
            local_100[0x10] = '\0';
            local_d0._M_p = (pointer)&local_c0;
            local_c8 = 0;
            local_c0._M_local_buf[0] = '\0';
            local_b0._M_p = (pointer)&local_a0;
            local_a8 = 0;
            local_a0._M_local_buf[0] = '\0';
            local_90._M_p = (pointer)&local_80;
            local_88 = 0;
            local_80._M_local_buf[0] = '\0';
            local_70._M_p = (pointer)&local_60;
            local_68 = 0;
            local_60._M_local_buf[0] = '\0';
            local_50._M_p = (pointer)&local_40;
            local_48 = 0;
            local_40._M_local_buf[0] = '\0';
            local_100._40_4_ = (undefined4)uVar6;
            sym_type = (uint8_t *)(local_180._72_8_ + uVar6 * 0x18 + 4);
            local_100._32_8_ = *(undefined8 *)(sym_type + 4);
            local_100._44_4_ = *(undefined4 *)(sym_type + 0xc);
            pEVar7 = (Elf_parser *)local_180;
            local_108 = uVar6;
            local_100._0_8_ = local_100 + 0x10;
            get_symbol_type_abi_cxx11_((string *)pEVar7,(Elf_parser *)this_00,sym_type);
            std::__cxx11::string::operator=((string *)&local_d0,(string *)pEVar7);
            if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
              operator_delete((void *)local_180._0_8_);
            }
            this_01 = (Elf_parser *)local_180;
            get_symbol_bind_abi_cxx11_((string *)this_01,pEVar7,sym_type);
            std::__cxx11::string::operator=((string *)&local_b0,(string *)this_01);
            if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
              operator_delete((void *)local_180._0_8_);
            }
            puVar2 = (uint *)(local_180._72_8_ + uVar6 * 0x18);
            get_symbol_visibility_abi_cxx11_
                      ((string *)local_180,this_01,(uint8_t *)((long)puVar2 + 5));
            pEVar7 = (Elf_parser *)local_180;
            std::__cxx11::string::operator=((string *)&local_90,(string *)local_180);
            if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
              operator_delete((void *)local_180._0_8_);
            }
            get_symbol_index_abi_cxx11_((string *)local_180,pEVar7,(uint16_t *)((long)puVar2 + 6));
            std::__cxx11::string::operator=((string *)local_100,(string *)local_180);
            if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
              operator_delete((void *)local_180._0_8_);
            }
            std::__cxx11::string::_M_assign((string *)&local_50);
            iVar5 = std::__cxx11::string::compare((char *)psVar1);
            if (iVar5 == 0) {
              std::__cxx11::string::string
                        ((string *)local_180,(char *)((ulong)*puVar2 + local_180._56_8_),&local_189)
              ;
              std::__cxx11::string::operator=((string *)&local_70,(string *)local_180);
              if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
                operator_delete((void *)local_180._0_8_);
              }
            }
            iVar5 = std::__cxx11::string::compare((char *)psVar1);
            if (iVar5 == 0) {
              std::__cxx11::string::string
                        ((string *)local_180,(char *)(local_180._48_8_ + (ulong)*puVar2),&local_189)
              ;
              std::__cxx11::string::operator=((string *)&local_70,(string *)local_180);
              if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
                operator_delete((void *)local_180._0_8_);
              }
            }
            this_00 = (char *)local_100;
            std::vector<elf_parser::symbol_t,_std::allocator<elf_parser::symbol_t>_>::push_back
                      (local_188,(value_type *)local_100);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_p != &local_40) {
              operator_delete(local_50._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_p != &local_60) {
              operator_delete(local_70._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_p != &local_80) {
              operator_delete(local_90._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_p != &local_a0) {
              operator_delete(local_b0._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_p != &local_c0) {
              operator_delete(local_d0._M_p);
            }
            if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
              operator_delete((void *)local_100._0_8_);
            }
            uVar6 = (ulong)((int)local_108 + 1);
          } while (uVar6 < (ulong)local_180._64_8_);
        }
      }
      else {
        this_00 = "SHT_DYNSYM";
        iVar5 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar5 == 0) goto LAB_00113f10;
      }
      local_130.super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)(local_180._40_8_ + 0x68);
    } while (local_130.
             super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>.
             _M_impl.super__Vector_impl_data._M_start != local_118);
  }
  std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::~vector(&local_130);
  return local_188;
}

Assistant:

std::vector<symbol_t> Elf_parser::get_symbols() {
    std::vector<section_t> secs = get_sections();

    // get headers for offsets
    //Elf64_Ehdr *ehdr = (Elf64_Ehdr*)m_mmap_program;
    //Elf64_Shdr *shdr = (Elf64_Shdr*)(m_mmap_program + ehdr->e_shoff);

    // get strtab
    char *sh_strtab_p = nullptr;
    for(auto &sec: secs) {
        if((sec.section_type == "SHT_STRTAB") && (sec.section_name == ".strtab")){
            sh_strtab_p = (char*)m_mmap_program + sec.section_offset;
            break;
        }
    }

    // get dynstr
    char *sh_dynstr_p = nullptr;
    for(auto &sec: secs) {
        if((sec.section_type == "SHT_STRTAB") && (sec.section_name == ".dynstr")){
            sh_dynstr_p = (char*)m_mmap_program + sec.section_offset;
            break;
        }
    }

    std::vector<symbol_t> symbols;
    for(auto &sec: secs) {
        if((sec.section_type != "SHT_SYMTAB") && (sec.section_type != "SHT_DYNSYM"))
            continue;

        auto total_syms = sec.section_size / sizeof(Elf64_Sym);
        auto syms_data = (Elf64_Sym*)(m_mmap_program + sec.section_offset);

        for (unsigned int i = 0; i < total_syms; ++i) {
            symbol_t symbol;
            symbol.symbol_num       = i;
            symbol.symbol_value     = syms_data[i].st_value;
            symbol.symbol_size      = syms_data[i].st_size;
            symbol.symbol_type      = get_symbol_type(syms_data[i].st_info);
            symbol.symbol_bind      = get_symbol_bind(syms_data[i].st_info);
            symbol.symbol_visibility= get_symbol_visibility(syms_data[i].st_other);
            symbol.symbol_index     = get_symbol_index(syms_data[i].st_shndx);
            symbol.symbol_section   = sec.section_name;
            
            if(sec.section_type == "SHT_SYMTAB")
                symbol.symbol_name = std::string(sh_strtab_p + syms_data[i].st_name);
            
            if(sec.section_type == "SHT_DYNSYM")
                symbol.symbol_name = std::string(sh_dynstr_p + syms_data[i].st_name);
            
            symbols.push_back(symbol);
        }
    }
    return symbols;
}